

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O2

string * compose_owerflow_err_msg_abi_cxx11_(string *__return_storage_ptr__,double d)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_180,"integer ");
  pcVar2 = "underflow";
  if (2147483647.0 < d) {
    pcVar2 = "owerflow";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,". Calculator can work with integers in range [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-0x80000000);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x7fffffff);
  std::operator<<(poVar1,']');
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string compose_owerflow_err_msg(double d)
{
	stringstream ss;
	ss << "integer "
		<< (d > INT32_MAX ? "owerflow" : "underflow")
		<< ". Calculator can work with integers in range ["
		<< INT32_MIN
		<< ", "
		<< INT32_MAX
		<< ']';
	return ss.str();
}